

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall NavierStokesBase::post_init_state(NavierStokesBase *this)

{
  ostream *poVar1;
  NavierStokesBase *pNVar2;
  int k;
  int lev;
  long lVar3;
  int lev_00;
  Real cur_divu_time;
  Print local_1a8;
  
  lev = *(int *)&(((this->super_AmrLevel).parent)->super_AmrCore).super_AmrMesh.super_AmrInfo.
                 field_0x8c;
  lVar3 = 0xe0;
  if (have_divu != 0) {
    lVar3 = (long)Divu_Type * 0xe0;
  }
  cur_divu_time =
       amrex::StateData::curTime
                 ((StateData *)
                  ((long)(((this->super_AmrLevel).state.
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           _M_impl.super__Vector_impl_data._M_start)->domain).smallend.vect +
                  lVar3 + -0x10));
  if (do_init_vort_proj != 0) {
    amrex::Abort_host(
                     "NavierStokesBase::post_init_state(): initialVorticityProject not tested with new Gradp!!! See comments Projection::initialVorticityProject.\n"
                     );
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"calling initialVorticityProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
    Projection::initialVorticityProject(projector,0);
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"done calling initialVorticityProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
  }
  if (projector != (Projection *)0x0 && do_init_proj != 0) {
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"calling initialVelocityProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
    Projection::initialVelocityProject(projector,0,cur_divu_time,have_divu,init_vel_iter);
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"done calling initialVelocityProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
  }
  initial_step = 1;
  lev_00 = lev;
  while (0 < lev_00) {
    lev_00 = lev_00 + -1;
    pNVar2 = getLevel(this,lev_00);
    (*(pNVar2->super_AmrLevel)._vptr_AmrLevel[0x2c])(pNVar2);
  }
  if (((do_init_proj != 0) && (projector != (Projection *)0x0)) && (gravity != 0.0)) {
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"calling initialPressureProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
    Projection::initialPressureProject(projector,0);
    if (verbose != 0) {
      poVar1 = amrex::OutStream();
      amrex::Print::Print(&local_1a8,poVar1);
      std::operator<<((ostream *)&local_1a8.ss,"done calling initialPressureProject");
      std::endl<char,std::char_traits<char>>((ostream *)&local_1a8.ss);
      amrex::Print::~Print(&local_1a8);
    }
  }
  if (do_init_proj == 0) {
    for (; -1 < lev; lev = lev + -1) {
      initOldFromNew(this,1,lev);
      initOldFromNew(this,2,lev);
    }
  }
  return;
}

Assistant:

void
NavierStokesBase::post_init_state ()
{
    const int finest_level = parent->finestLevel();
    const Real divu_time   = have_divu ? state[Divu_Type].curTime()
                                       : state[Press_Type].curTime();

    if (do_init_vort_proj)
    {
        amrex::Abort("NavierStokesBase::post_init_state(): initialVorticityProject not tested with new Gradp!!! See comments Projection::initialVorticityProject.\n");
        //
	// NOTE: this assumes have_divu == 0.
	// Only used if vorticity is used to initialize the velocity field.
        //
        AMREX_ASSERT(!(projector == 0));

	if (verbose) amrex::Print() << "calling initialVorticityProject" << std::endl;

	projector->initialVorticityProject(0);

	if (verbose) amrex::Print() << "done calling initialVorticityProject" << std::endl;
    }

    if (do_init_proj && projector)
    {
      //
      // Do sync project to define divergence free velocity field.
      //
      if (verbose) amrex::Print() << "calling initialVelocityProject" << std::endl;

      projector->initialVelocityProject(0,divu_time,have_divu,init_vel_iter);

      if (verbose) amrex::Print() << "done calling initialVelocityProject" << std::endl;
    }

    NavierStokesBase::initial_step = true;
    //
    // Average velocity and scalar data down from finer levels
    // so that conserved data is consistant between levels.
    // This might not be the most efficient way of doing things
    // (since initialVelocityProject will average down vel, P and Gradp),
    // but it does ensure everything is averaged down for all cases
    // (e.g. initialVelocityProject doesn't get called or init_vel_iter<=0).
    //
    for (int k = finest_level-1; k>= 0; k--)
    {
      getLevel(k).avgDown();
    }

    if (do_init_proj && projector && (std::fabs(gravity)) > 0.){
      //
      // Do projection to establish initially hydrostatic pressure field.
      //
      if (verbose) amrex::Print() << "calling initialPressureProject" << std::endl;

      projector->initialPressureProject(0);

      if (verbose) amrex::Print() << "done calling initialPressureProject" << std::endl;
    }
    //
    // Make sure there's not NANs in old pressure field.
    // End up with P_old = P_new as is the case when exiting initialPressureProject
    //
    if(!do_init_proj)
    {
      for (int k = finest_level; k>= 0; k--)
      {
	initOldFromNew(Press_Type, k);
	initOldFromNew(Gradp_Type, k);
    }
    }
}